

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib507.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint *puVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  FILE *pFVar11;
  timeval tVar12;
  undefined8 uStack_1e0;
  int still_running;
  int maxfd;
  long local_1c8;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  
  tv_test_start = tutil_tvnow();
  uVar1 = curl_global_init(3);
  pFVar11 = _stderr;
  if (uVar1 != 0) {
    uVar7 = curl_easy_strerror(uVar1);
    fprintf(pFVar11,"%s:%d curl_global_init() failed, with code %d (%s)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib507.c"
            ,0x29,(ulong)uVar1,uVar7);
    goto LAB_00102797;
  }
  lVar3 = curl_multi_init();
  if (lVar3 == 0) {
    lVar4 = 0;
    fprintf(_stderr,"%s:%d curl_multi_init() failed\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib507.c"
            ,0x2b);
    uVar8 = 0x7b;
LAB_00102665:
    uVar1 = 0xffffffff;
  }
  else {
    lVar4 = curl_easy_init();
    if (lVar4 == 0) {
      lVar4 = 0;
      fprintf(_stderr,"%s:%d curl_easy_init() failed\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib507.c"
              ,0x2d);
      uVar8 = 0x7c;
      goto LAB_00102665;
    }
    uVar1 = curl_easy_setopt(lVar4,0x2712,URL);
    pFVar11 = _stderr;
    if (uVar1 == 0) {
      uVar1 = curl_easy_setopt(lVar4,0x2a,1);
      pFVar11 = _stderr;
      if (uVar1 != 0) {
        uVar9 = (ulong)uVar1;
        uVar7 = curl_easy_strerror(uVar1);
        pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_1e0 = 0x30;
        goto LAB_001025f9;
      }
      uVar1 = curl_multi_add_handle(lVar3,lVar4);
      pFVar11 = _stderr;
      if (uVar1 != 0) {
        uVar9 = (ulong)uVar1;
        uVar7 = curl_multi_strerror(uVar1);
        pcVar10 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uStack_1e0 = 0x32;
        goto LAB_001025f9;
      }
      uVar1 = curl_multi_perform(lVar3,&still_running);
      pFVar11 = _stderr;
      if (uVar1 != 0) {
        uVar9 = (ulong)uVar1;
        uVar7 = curl_multi_strerror(uVar1);
        pcVar10 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
        uStack_1e0 = 0x34;
        goto LAB_001025f9;
      }
      if (still_running < 0) {
        fprintf(_stderr,
                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib507.c"
                ,0x34);
        uVar8 = 0x7a;
        goto LAB_00102665;
      }
      tVar12 = tutil_tvnow();
      lVar5 = tutil_tvdiff(tVar12,tv_test_start);
      if (60000 < lVar5) {
        fprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib507.c"
                ,0x36);
        uVar8 = 0x7d;
        goto LAB_00102665;
      }
      local_1c8 = lVar4;
      do {
        if (still_running == 0) {
          lVar4 = curl_multi_info_read(lVar3,&still_running);
          uVar8 = 0;
          uVar1 = 0;
          if (lVar4 == 0) goto LAB_00102773;
          uVar1 = *(uint *)(lVar4 + 0x10);
          lVar4 = local_1c8;
          goto LAB_0010277c;
        }
        maxfd = -99;
        for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
          fdread.__fds_bits[lVar4] = 0;
        }
        for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
          fdwrite.__fds_bits[lVar4] = 0;
        }
        for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
          fdexcep.__fds_bits[lVar4] = 0;
        }
        timeout.tv_sec = 1;
        timeout.tv_usec = 0;
        uVar1 = curl_multi_fdset(lVar3,&fdread,&fdwrite,&fdexcep,&maxfd);
        pFVar11 = _stderr;
        if (uVar1 != 0) {
          uVar7 = curl_multi_strerror(uVar1);
          pcVar10 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
          uStack_1e0 = 0x45;
LAB_0010273b:
          fprintf(pFVar11,pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib507.c"
                  ,uStack_1e0,(ulong)uVar1,uVar7);
          goto LAB_00102773;
        }
        if (maxfd < -1) {
          pcVar10 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
          uStack_1e0 = 0x45;
LAB_00102768:
          fprintf(_stderr,pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib507.c"
                  ,uStack_1e0);
          uVar1 = 0x7a;
          goto LAB_00102773;
        }
        iVar2 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&timeout);
        if (iVar2 == -1) {
          puVar6 = (uint *)__errno_location();
          pFVar11 = _stderr;
          uVar1 = *puVar6;
          pcVar10 = strerror(uVar1);
          fprintf(pFVar11,"%s:%d select() failed, with errno %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib507.c"
                  ,0x49,(ulong)uVar1,pcVar10);
          uVar1 = 0x79;
          goto LAB_00102773;
        }
        tVar12 = tutil_tvnow();
        lVar4 = tutil_tvdiff(tVar12,tv_test_start);
        if (60000 < lVar4) {
          uStack_1e0 = 0x4b;
          goto LAB_0010270c;
        }
        uVar1 = curl_multi_perform(lVar3,&still_running);
        pFVar11 = _stderr;
        if (uVar1 != 0) {
          uVar7 = curl_multi_strerror(uVar1);
          pcVar10 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
          uStack_1e0 = 0x4d;
          goto LAB_0010273b;
        }
        if (still_running < 0) {
          pcVar10 = 
          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
          uStack_1e0 = 0x4d;
          goto LAB_00102768;
        }
        tVar12 = tutil_tvnow();
        lVar4 = tutil_tvdiff(tVar12,tv_test_start);
      } while (lVar4 < 0xea61);
      uStack_1e0 = 0x4f;
LAB_0010270c:
      fprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib507.c"
              ,uStack_1e0);
      uVar1 = 0x7d;
LAB_00102773:
      uVar8 = uVar1;
      uVar1 = 0xffffffff;
      lVar4 = local_1c8;
    }
    else {
      uVar9 = (ulong)uVar1;
      uVar7 = curl_easy_strerror(uVar1);
      pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      uStack_1e0 = 0x2f;
LAB_001025f9:
      uVar8 = (uint)uVar9;
      fprintf(pFVar11,pcVar10,
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib507.c"
              ,uStack_1e0,uVar9,uVar7);
      uVar1 = 0xffffffff;
    }
  }
LAB_0010277c:
  curl_multi_cleanup(lVar3);
  curl_easy_cleanup(lVar4);
  curl_global_cleanup();
  if (uVar8 != 0) {
    uVar1 = uVar8;
  }
LAB_00102797:
  return uVar1;
}

Assistant:

int test(char *URL)
{
  CURL* curls = NULL;
  CURLM* multi = NULL;
  int still_running;
  int i = -1;
  int res = 0;
  CURLMsg *msg;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(curls);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);

  multi_add_handle(multi, curls);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

  msg = curl_multi_info_read(multi, &still_running);
  if(msg)
    /* this should now contain a result code from the easy handle,
       get it */
    i = msg->data.result;

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}